

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O2

void __thiscall
glcts::MultisampleTextureTexStorage2DZeroSampleTest::deinit
          (MultisampleTextureTexStorage2DZeroSampleTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0x9100,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,
                  "Failed to unbind a texture object from GL_TEXTURE_2D_MULTISAMPLE texture target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x536);
  (**(code **)(lVar3 + 0x480))(1,&this->to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to delete texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x53b);
  this->to_id = 0;
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureTexStorage2DZeroSampleTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE texture target */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Failed to unbind a texture object from GL_TEXTURE_2D_MULTISAMPLE texture target");

	/* Delete texture object */
	gl.deleteTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete texture object");

	to_id = 0;

	/* Call base class deinitialization routine */
	glcts::TestCase::deinit();
}